

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O1

void Database::create(string *fname)

{
  bool bVar1;
  runtime_error *this;
  ExclusiveFile lock;
  Database empty;
  ExclusiveFile local_144;
  undefined1 local_140 [248];
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_48;
  
  ExclusiveFile::ExclusiveFile(&local_144,fname);
  bVar1 = ExclusiveFile::is_ok(&local_144);
  if (bVar1) {
    Database((Database *)local_140,fname,false);
    save((Database *)local_140);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_48);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_140 + 0xe8),local_140[0xe0]);
    std::
    vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
    ::~vector((vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
               *)(local_140 + 200));
    if ((pointer)local_140._176_8_ != (pointer)0x0) {
      operator_delete((void *)local_140._176_8_,local_140._192_8_ - local_140._176_8_);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
                 *)(local_140 + 0x80));
    std::experimental::filesystem::v1::__cxx11::path::~path((path *)(local_140 + 0x40));
    std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_140);
    ExclusiveFile::~ExclusiveFile(&local_144);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"File already exists");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Database::create(const std::string &fname) {
    ExclusiveFile lock(fname);
    if (!lock.is_ok()) {
        throw std::runtime_error("File already exists");
    }
    Database empty(fname, false);
    empty.save();
}